

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

Kind __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::advance
          (SimpleParser<avro::parsing::DummyHandler> *this,Kind k)

{
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *this_00;
  Kind actual;
  tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar1;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *psVar2;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *pwVar3;
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar4;
  element_type *peVar5;
  pair<avro::parsing::Symbol::Kind,_avro::parsing::Symbol::Kind> *ppVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  _Elt_pointer pSVar9;
  value_type *pvVar10;
  pointer __x;
  ProductionPtr pp;
  weak_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_1c8 [2];
  undefined1 local_1a8 [8];
  shared_count local_1a0 [46];
  
  this_00 = &this->parsingStack;
LAB_0017162d:
  do {
    while( true ) {
      pSVar9 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar9 == (this->parsingStack).c.
                    super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar9 = (this->parsingStack).c.
                 super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      actual = pSVar9[-1].kind_;
      if (actual == k) goto LAB_0017181d;
      if (0xe < actual - sNull) break;
      throwMismatch(k,actual);
    }
    switch(actual) {
    case sRoot:
      ptVar1 = boost::
               any_cast<boost::tuples::tuple<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar9[-1].extra_);
      peVar5 = (ptVar1->super_type).head.px;
      for (pvVar10 = (peVar5->
                     super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pvVar10 !=
          (peVar5->super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
          )._M_impl.super__Vector_impl_data._M_finish; pvVar10 = pvVar10 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar10);
        peVar5 = (ptVar1->super_type).head.px;
      }
      goto LAB_0017162d;
    case sRepeater:
      ptVar4 = boost::
               any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                         (&pSVar9[-1].extra_);
      (ptVar4->super_type).head = (ptVar4->super_type).head - 1;
      peVar5 = (ptVar4->super_type).tail.tail.head.px;
      for (__x = (peVar5->
                 super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_start;
          __x != (peVar5->
                 super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,__x);
        peVar5 = (ptVar4->super_type).tail.tail.head.px;
      }
      goto LAB_0017162d;
    case sIndirect:
      psVar2 = boost::
               any_cast<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar9[-1].extra_);
      local_1a8 = (undefined1  [8])psVar2->px;
      local_1a0[0].pi_ = (psVar2->pn).pi_;
      if (local_1a0[0].pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1a0[0].pi_)->use_count_ = (local_1a0[0].pi_)->use_count_ + 1;
        UNLOCK();
      }
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar10 = *(value_type **)local_1a8; pvVar10 != *(pointer *)((long)local_1a8 + 8);
          pvVar10 = pvVar10 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar10);
      }
      break;
    case sSymbolic:
      pwVar3 = boost::
               any_cast<boost::weak_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>const&>
                         (&pSVar9[-1].extra_);
      local_1c8[0].px = pwVar3->px;
      local_1c8[0].pn.pi_ = (pwVar3->pn).pi_;
      if (local_1c8[0].pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1c8[0].pn.pi_)->weak_count_ = (local_1c8[0].pn.pi_)->weak_count_ + 1;
        UNLOCK();
      }
      boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>::
      shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                ((shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>
                  *)local_1a8,local_1c8);
      boost::detail::weak_count::~weak_count(&local_1c8[0].pn);
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      for (pvVar10 = *(value_type **)local_1a8; pvVar10 != *(pointer *)((long)local_1a8 + 8);
          pvVar10 = pvVar10 + 1) {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&this_00->c,pvVar10);
      }
      break;
    case sSkipStart:
      goto switchD_0017167d_caseD_1b;
    case sResolve:
      ppVar6 = boost::any_cast<std::pair<avro::parsing::Symbol::Kind,avro::parsing::Symbol::Kind>>
                         (&pSVar9[-1].extra_);
      if (ppVar6->second != k) {
        throwMismatch(ppVar6->second,k);
      }
      k = ppVar6->first;
LAB_0017181d:
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      return k;
    default:
      if (actual == sError) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(0x18);
        Symbol::extra<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   pSVar9 + -1);
        std::runtime_error::runtime_error((runtime_error *)(puVar8 + 1),(string *)local_1a8);
        *puVar8 = 0x190860;
        puVar8[1] = 0x190890;
        __cxa_throw(puVar8,&Exception::typeinfo,Exception::~Exception);
      }
    case sAlternative:
    case sPlaceholder:
    case sEnumAdjust:
    case sUnionAdjust:
      if (7 < actual - sRecordStart) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Encountered ",0xc);
        poVar7 = std::operator<<((ostream *)local_1a8,
                                 *(char **)(Symbol::stringValues + (ulong)pSVar9[-1].kind_ * 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," while looking for ",0x13);
        std::operator<<(poVar7,*(char **)(Symbol::stringValues + (ulong)k * 8));
        puVar8 = (undefined8 *)__cxa_allocate_exception(0x18);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error((runtime_error *)(puVar8 + 1),(string *)local_1c8);
        *puVar8 = 0x190860;
        puVar8[1] = 0x190890;
        __cxa_throw(puVar8,&Exception::typeinfo,Exception::~Exception);
      }
      std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
                (&this_00->c);
      if (actual == sWriterUnion) {
        selectBranch(this,0);
      }
      goto LAB_0017162d;
    }
    boost::detail::shared_count::~shared_count(local_1a0);
  } while( true );
switchD_0017167d_caseD_1b:
  std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back(&this_00->c);
  skip(this,this->decoder_);
  goto LAB_0017162d;
}

Assistant:

Symbol::Kind advance(Symbol::Kind k) {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.kind() == k) {
                parsingStack.pop();
                return k;
            } else if (s.isTerminal()) {
                throwMismatch(k, s.kind());
            } else {
                switch (s.kind()) {
                case Symbol::sRoot:
                    append(boost::tuples::get<0>(*s.extrap<RootInfo>()));
                    continue;
                case Symbol::sIndirect:
                    {
                        ProductionPtr pp =
                            s.extra<ProductionPtr>();
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sSymbolic:
                    {
                        ProductionPtr pp(
                            s.extra<boost::weak_ptr<Production> >());
                        parsingStack.pop();
                        append(pp);
                    }
                    continue;
                case Symbol::sRepeater:
                    {
                        RepeaterInfo *p = s.extrap<RepeaterInfo>();
                        --boost::tuples::get<0>(*p);
                        append(boost::tuples::get<2>(*p));
                    }
                    continue;
                case Symbol::sError:
                    throw Exception(s.extra<std::string>());
                case Symbol::sResolve:
                    {
                        const std::pair<Symbol::Kind, Symbol::Kind>* p =
                            s.extrap<std::pair<Symbol::Kind, Symbol::Kind> >();
                        assertMatch(p->second, k);
                        Symbol::Kind result = p->first;
                        parsingStack.pop();
                        return result;
                    }
                case Symbol::sSkipStart:
                    parsingStack.pop();
                    skip(*decoder_);
                    break;
                default:
                    if (s.isImplicitAction()) {
                        size_t n = handler_.handle(s);
                        if (s.kind() == Symbol::sWriterUnion) {
                            parsingStack.pop();
                            selectBranch(n); 
                        } else {
                            parsingStack.pop();
                        }
                    } else {
                        std::ostringstream oss;
                        oss << "Encountered " << Symbol::toString(s.kind())
                            << " while looking for " << Symbol::toString(k);
                        throw Exception(oss.str());
                    }
                }
            }
        }
    }